

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  NeuralNetworkLayer *pNVar3;
  bool bVar4;
  long lVar5;
  UniDirectionalLSTMLayerParams *pUVar6;
  LayerUnion LVar7;
  long *plVar8;
  size_type *psVar9;
  WeightParams *pWVar10;
  LSTMParams *pLVar11;
  LSTMWeightParams *pLVar12;
  long lVar13;
  InternalMetadataWithArenaLite *pIVar14;
  uint64_t expectedUnits;
  bool bVar15;
  string err;
  UniDirectionalLSTMLayerParams recurrent;
  _func_int **local_170;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  string local_148;
  string local_128;
  Result *local_108;
  uint64_t local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [24];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  LSTMParams *local_a8;
  LSTMWeightParams *local_a0;
  uint64 local_98;
  uint64_t local_90;
  uint64_t local_80;
  NeuralNetworkLayer *local_78;
  string local_70;
  LSTMParams local_50;
  
  Result::Result((Result *)&local_170);
  validateInputCount((Result *)local_d0,layer,1,3);
  local_170 = (_func_int **)local_d0;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT44(local_b8._M_allocated_capacity._4_4_,
                             local_b8._M_allocated_capacity._0_4_) + 1);
  }
  bVar4 = Result::good((Result *)&local_170);
  if (bVar4) {
    validateOutputCount((Result *)local_d0,layer,3,3);
    local_170 = (_func_int **)local_d0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT44(local_b8._M_allocated_capacity._4_4_,
                               local_b8._M_allocated_capacity._0_4_) + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_170);
  if ((!bVar4) || (bVar4 = Result::good((Result *)&local_170), !bVar4)) goto LAB_0052f6c3;
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UniDirectionalLSTM","");
    validateInputOutputRankEquality((Result *)local_d0,layer,&local_70,&this->blobNameToRank);
    local_170 = (_func_int **)local_d0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT44(local_b8._M_allocated_capacity._4_4_,
                               local_b8._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_0052f6c3;
    local_f8 = (undefined1  [8])local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"UniDirectionalLSTM","");
    validateRankCount((Result *)local_d0,layer,(string *)local_f8,5,5,&this->blobNameToRank);
    local_170 = (_func_int **)local_d0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT44(local_b8._M_allocated_capacity._4_4_,
                               local_b8._M_allocated_capacity._0_4_) + 1);
    }
    if (local_f8 != (undefined1  [8])local_e8) {
      operator_delete((void *)local_f8,local_e8._0_8_ + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_0052f6c3;
  }
  local_108 = __return_storage_ptr__;
  local_78 = layer;
  if (layer->_oneof_case_[0] == 0x1a4) {
    LVar7 = layer->layer_;
  }
  else {
    LVar7.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance();
  }
  pIVar14 = &(LVar7.batchnorm_)->mean_->_internal_metadata_;
  if ((LVar7.batchnorm_)->mean_ == (WeightParams *)0x0) {
    pIVar14 = (InternalMetadataWithArenaLite *)0x0;
  }
  lVar5 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                 &(LVar7.convolution_)->kernelsize_)->super_RepeatedPtrFieldBase).current_size_;
  if (lVar5 != 0) {
    lVar13 = 0;
    do {
      validateRecurrentActivationParams
                ((Result *)local_d0,
                 *(ActivationParams **)
                  ((long)&(pIVar14->
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          ).ptr_ + lVar13));
      local_170 = (_func_int **)local_d0;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,
                        CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                 local_b8._M_allocated_capacity._0_4_) + 1);
      }
      bVar4 = Result::good((Result *)&local_170);
      bVar15 = lVar5 * 8 + -8 != lVar13;
      lVar13 = lVar13 + 8;
    } while (bVar4 && bVar15);
  }
  pNVar3 = local_78;
  if (local_78->_oneof_case_[0] == 0x1a4) {
    LVar7 = (LayerUnion)(local_78->layer_).convolution_;
    pLVar12 = (LVar7.unidirectionallstm_)->weightparams_;
    __return_storage_ptr__ = local_108;
    if (pLVar12 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
  }
  else {
    pUVar6 = Specification::UniDirectionalLSTMLayerParams::default_instance();
    __return_storage_ptr__ = local_108;
    pLVar12 = pUVar6->weightparams_;
    if (pLVar12 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    if (pNVar3->_oneof_case_[0] == 0x1a4) {
      LVar7 = pNVar3->layer_;
    }
    else {
      LVar7.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance();
    }
  }
  pLVar11 = *(LSTMParams **)&(LVar7.unidirectionallstm_)->params_;
  if (pLVar11 == (LSTMParams *)0x0) {
    pLVar11 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,pLVar11);
  validateLSTMWeightParams((Result *)local_d0,pLVar12,&local_50);
  local_170 = (_func_int **)local_d0;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT44(local_b8._M_allocated_capacity._4_4_,
                             local_b8._M_allocated_capacity._0_4_) + 1);
  }
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar4 = Result::good((Result *)&local_170);
  if (!bVar4) {
LAB_0052f6c3:
    *(_func_int ***)__return_storage_ptr__ = local_170;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p == &local_158) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_160;
    return __return_storage_ptr__;
  }
  if (pNVar3->_oneof_case_[0] == 0x1a4) {
    LVar7 = pNVar3->layer_;
  }
  else {
    LVar7.unidirectionallstm_ = Specification::UniDirectionalLSTMLayerParams::default_instance();
  }
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_d0,LVar7.unidirectionallstm_);
  if (local_b8._M_allocated_capacity._0_4_ != 3) {
    std::operator+(&local_148,"Unidirectional LSTM layer:",(pNVar3->name_).ptr_);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      local_e8._0_8_ = *psVar9;
      local_e8._8_8_ = plVar8[3];
      local_f8 = (undefined1  [8])local_e8;
    }
    else {
      local_e8._0_8_ = *psVar9;
      local_f8 = (undefined1  [8])*plVar8;
    }
    local_f0._M_p = (pointer)plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
    if (local_f8 != (undefined1  [8])local_e8) {
      operator_delete((void *)local_f8,local_e8._0_8_ + 1);
    }
    goto LAB_0053092b;
  }
  pLVar12 = local_a0;
  if (local_a0 == (LSTMWeightParams *)0x0) {
    pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
  }
  local_100 = local_90;
  pWVar10 = pLVar12->inputgateweightmatrix_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  expectedUnits = local_98 * local_90;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
  psVar2 = (pNVar3->name_).ptr_;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"input gate weight matrix","");
  validateGeneralWeightParams
            ((Result *)local_f8,pWVar10,expectedUnits,local_100,&local_148,psVar2,&local_128);
  local_170 = (_func_int **)local_f8;
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
  if (local_f0._M_p != local_e8 + 8) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Result::good((Result *)&local_170);
  if (bVar4) {
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->forgetgateweightmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"forget gate weight matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,expectedUnits,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->blockinputweightmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"block input gate weight matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,expectedUnits,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->outputgateweightmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"output gate weight matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,expectedUnits,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->inputgaterecursionmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"input gate recursion matrix","");
    local_80 = local_100 * local_100;
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,local_80,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->forgetgaterecursionmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"forget gate recursion matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,local_80,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->blockinputrecursionmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"block input gate recursion matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,local_80,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar12 = local_a0;
    if (local_a0 == (LSTMWeightParams *)0x0) {
      pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
    }
    pWVar10 = pLVar12->outputgaterecursionmatrix_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","");
    psVar2 = (pNVar3->name_).ptr_;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"output gate recursion matrix","");
    validateGeneralWeightParams
              ((Result *)local_f8,pWVar10,local_80,local_100,&local_148,psVar2,&local_128);
    local_170 = (_func_int **)local_f8;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
    paVar1 = &local_148.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    bVar4 = Result::good((Result *)&local_170);
    if (!bVar4) goto LAB_00530868;
    pLVar11 = local_a8;
    if (local_a8 == (LSTMParams *)0x0) {
      pLVar11 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
    }
    if (pLVar11->hasbiasvectors_ == true) {
      pLVar12 = local_a0;
      if (local_a0 == (LSTMWeightParams *)0x0) {
        pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
      }
      pWVar10 = pLVar12->inputgatebiasvector_;
      if (pWVar10 == (WeightParams *)0x0) {
        pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      local_148._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Unidirectional LSTM","")
      ;
      psVar2 = (pNVar3->name_).ptr_;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"input gate bias vector","");
      validateGeneralWeightParams
                ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
      local_170 = (_func_int **)local_f8;
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
      if (local_f0._M_p != local_e8 + 8) {
        operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good((Result *)&local_170);
      if (bVar4) {
        pLVar12 = local_a0;
        if (local_a0 == (LSTMWeightParams *)0x0) {
          pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
        }
        pWVar10 = pLVar12->forgetgatebiasvector_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"Unidirectional LSTM","");
        psVar2 = (pNVar3->name_).ptr_;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"forget gate bias vector","");
        validateGeneralWeightParams
                  ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
        local_170 = (_func_int **)local_f8;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
        if (local_f0._M_p != local_e8 + 8) {
          operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_170);
        if (bVar4) {
          pLVar12 = local_a0;
          if (local_a0 == (LSTMWeightParams *)0x0) {
            pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
          }
          pWVar10 = pLVar12->blockinputbiasvector_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"Unidirectional LSTM","");
          psVar2 = (pNVar3->name_).ptr_;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"block input bias vector","");
          validateGeneralWeightParams
                    ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
          local_170 = (_func_int **)local_f8;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
          if (local_f0._M_p != local_e8 + 8) {
            operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good((Result *)&local_170);
          if (bVar4) {
            pLVar12 = local_a0;
            if (local_a0 == (LSTMWeightParams *)0x0) {
              pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar10 = pLVar12->outputgatebiasvector_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"output gate bias vector","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = Result::good((Result *)&local_170);
            if (bVar4) goto LAB_0053048b;
          }
        }
      }
    }
    else {
LAB_0053048b:
      if (local_a8 == (LSTMParams *)0x0) {
        local_a8 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
      }
      if (local_a8->haspeepholevectors_ == true) {
        pLVar12 = local_a0;
        if (local_a0 == (LSTMWeightParams *)0x0) {
          pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
        }
        pWVar10 = pLVar12->inputgatepeepholevector_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"Unidirectional LSTM","");
        psVar2 = (pNVar3->name_).ptr_;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"input gate peep hole vector","");
        validateGeneralWeightParams
                  ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
        local_170 = (_func_int **)local_f8;
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
        if (local_f0._M_p != local_e8 + 8) {
          operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_170);
        if (bVar4) {
          pLVar12 = local_a0;
          if (local_a0 == (LSTMWeightParams *)0x0) {
            pLVar12 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
          }
          pWVar10 = pLVar12->forgetgatepeepholevector_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_148._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"Unidirectional LSTM","");
          psVar2 = (pNVar3->name_).ptr_;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"forget gate peep hole vector","");
          validateGeneralWeightParams
                    ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
          local_170 = (_func_int **)local_f8;
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
          if (local_f0._M_p != local_e8 + 8) {
            operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Result::good((Result *)&local_170);
          if (bVar4) {
            if (local_a0 == (LSTMWeightParams *)0x0) {
              local_a0 = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
            }
            pWVar10 = local_a0->outputgatepeepholevector_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_148._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Unidirectional LSTM","");
            psVar2 = (pNVar3->name_).ptr_;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"output gate peep hole vector","");
            validateGeneralWeightParams
                      ((Result *)local_f8,pWVar10,local_100,1,&local_148,psVar2,&local_128);
            local_170 = (_func_int **)local_f8;
            std::__cxx11::string::operator=((string *)&local_168,(string *)&local_f0);
            if (local_f0._M_p != local_e8 + 8) {
              operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            Result::good((Result *)&local_170);
          }
        }
      }
    }
    *(_func_int ***)local_108 = local_170;
    paVar1 = &(local_108->m_message).field_2;
    (local_108->m_message)._M_dataplus._M_p = (pointer)paVar1;
    __return_storage_ptr__ = local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p == &local_158) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
      *(undefined8 *)((long)&(local_108->m_message).field_2 + 8) = local_158._8_8_;
    }
    else {
      (local_108->m_message)._M_dataplus._M_p = local_168._M_p;
      (local_108->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    }
  }
  else {
LAB_00530868:
    *(_func_int ***)__return_storage_ptr__ = local_170;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p == &local_158) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]);
    }
  }
  local_168._M_p = (pointer)&local_158;
  (__return_storage_ptr__->m_message)._M_string_length = local_160;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
LAB_0053092b:
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    return __return_storage_ptr__;
  }
  operator_delete(local_168._M_p,
                  CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 3);
    if (r.good()) {
        r = validateOutputCount(layer, 3, 3);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                    "Unidirectional LSTM", layer.name(), "output gate weight matrix");
    if(!r.good()) return r;
    // Check recursion matrices' sizes
    r = validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                    "Unidirectional LSTM", layer.name(), "output gate recursion matrix");
    if(!r.good()) return r;
    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "input gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "forget gate peep hole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                        "Unidirectional LSTM", layer.name(), "output gate peep hole vector");
        if(!r.good()) return r;
    }

    return r;
}